

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::~cmMakefile(cmMakefile *this)

{
  pointer ppcVar1;
  
  cmDeleteAll<std::vector<cmInstallGenerator*,std::allocator<cmInstallGenerator*>>>
            (&this->InstallGenerators);
  cmDeleteAll<std::vector<cmTestGenerator*,std::allocator<cmTestGenerator*>>>(&this->TestGenerators)
  ;
  cmDeleteAll<std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>(&this->SourceFiles);
  cmDeleteAll<std::map<std::__cxx11::string,cmTest*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTest*>>>>
            (&this->Tests);
  cmDeleteAll<std::vector<cmTarget*,std::allocator<cmTarget*>>>(&this->ImportedTargetsOwned);
  cmDeleteAll<std::vector<cmCommand*,std::allocator<cmCommand*>>>(&this->FinalPassCommands);
  cmDeleteAll<std::vector<cmFunctionBlocker*,std::allocator<cmFunctionBlocker*>>>
            (&this->FunctionBlockers);
  ppcVar1 = (this->FunctionBlockers).
            super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->FunctionBlockers).
      super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar1) {
    (this->FunctionBlockers).
    super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar1;
  }
  if ((long)(this->PolicyStack).
            super__Vector_base<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->PolicyStack).
            super__Vector_base<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x30) {
    cmSystemTools::Error
              ("Internal CMake Error, Policy Stack has not been popped properly",(char *)0x0,
               (char *)0x0,(char *)0x0);
  }
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            (&(this->QtUiFilesWithOptions).
              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->OutputToSource)._M_h);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->PolicyBarriers).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>::
  ~_Vector_base(&(this->PolicyStack).
                 super__Vector_base<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
               );
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->ImportedTargets)._M_h);
  std::_Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>::~_Vector_base
            (&(this->ImportedTargetsOwned).
              super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>);
  std::_Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>::
  ~_Vector_base(&(this->CallStack).
                 super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>
               );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->ListFileStack);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
               *)&this->Properties);
  std::_Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~_Vector_base
            (&(this->UnConfiguredDirectories).
              super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>);
  cmsys::RegularExpression::~RegularExpression(&this->cmNamedCurly);
  cmsys::RegularExpression::~RegularExpression(&this->cmAtVarRegex);
  cmsys::RegularExpression::~RegularExpression(&this->cmDefine01Regex);
  cmsys::RegularExpression::~RegularExpression(&this->cmDefineRegex);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->MacrosList);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&this->LoopBlockCounter);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->FunctionBlockerBarriers).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::~_Vector_base
            (&(this->FunctionBlockers).
              super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>);
  std::_Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>::~_Vector_base
            (&(this->FinalPassCommands).
              super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&this->SourceGroups);
  std::__cxx11::string::~string((string *)&this->DefineFlagsOrig);
  std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::~vector
            (&this->CompileDefinitionsEntries);
  std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::~vector
            (&this->CompileOptionsEntries);
  std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::~vector
            (&this->IncludeDirectoriesEntries);
  std::__cxx11::string::~string((string *)&this->DefineFlags);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->HeaderFileExtensions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->SourceFileExtensions);
  std::__cxx11::string::~string((string *)&this->ComplainFileRegularExpression);
  std::__cxx11::string::~string((string *)&this->IncludeFileRegularExpression);
  std::_Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::~_Vector_base
            (&(this->TestGenerators).
              super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>);
  std::_Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::~_Vector_base
            (&(this->InstallGenerators).
              super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
  ::~vector(&this->LinkLibraries);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->OutputFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->ListFiles);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->SystemIncludeDirectories)._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->LinkDirectories);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>_>
  ::~_Rb_tree(&(this->Tests)._M_t);
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            (&(this->SourceFiles).
              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
  std::
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::~_Rb_tree(&(this->GeneratorTargets)._M_t);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->AliasTargets)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->Targets)._M_h);
  std::__cxx11::string::~string((string *)&this->ProjectName);
  std::
  _Rb_tree<cmListFileContext,_cmListFileContext,_std::_Identity<cmListFileContext>,_std::less<cmListFileContext>,_std::allocator<cmListFileContext>_>
  ::~_Rb_tree(&(this->CMP0054ReportedIds)._M_t);
  cmsys::auto_ptr<cmMakefile::Internals>::~auto_ptr(&this->Internal);
  return;
}

Assistant:

cmMakefile::~cmMakefile()
{
  cmDeleteAll(this->InstallGenerators);
  cmDeleteAll(this->TestGenerators);
  cmDeleteAll(this->SourceFiles);
  cmDeleteAll(this->Tests);
  cmDeleteAll(this->ImportedTargetsOwned);
  cmDeleteAll(this->FinalPassCommands);
  cmDeleteAll(this->FunctionBlockers);
  this->FunctionBlockers.clear();
  if (this->PolicyStack.size() != 1)
  {
    cmSystemTools::Error("Internal CMake Error, Policy Stack has not been"
      " popped properly");
  }
}